

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall PrimitiveTestClass::Deserialize(PrimitiveTestClass *this,CJSON *json)

{
  string *psVar1;
  char cVar2;
  uchar uVar3;
  short sVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  unsigned_long uVar9;
  longlong lVar10;
  longdouble *plVar11;
  char *pcVar12;
  uchar *puVar13;
  short *psVar14;
  unsigned_short *puVar15;
  int *piVar16;
  uint *puVar17;
  long *plVar18;
  unsigned_long *puVar19;
  longlong *plVar20;
  unsigned_long_long *puVar21;
  float *pfVar22;
  double *pdVar23;
  TestArrObj *pTVar24;
  longdouble in_ST0;
  float fVar25;
  double dVar26;
  allocator<char> local_539;
  string local_538 [32];
  undefined1 local_518 [24];
  string local_500 [32];
  undefined1 local_4e0 [24];
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  size_t local_2a0;
  size_t tmp;
  allocator<char> local_289;
  string local_288;
  longdouble local_268;
  allocator<char> local_251;
  undefined1 local_250 [48];
  string local_220;
  float local_200;
  allocator<char> local_1f9;
  string local_1f8;
  unsigned_long_long local_1d8;
  allocator<char> local_1c9;
  string local_1c8;
  longlong local_1a8;
  allocator<char> local_199;
  string local_198;
  unsigned_long local_178;
  allocator<char> local_169;
  string local_168;
  long local_148;
  allocator<char> local_139;
  string local_138;
  uint local_118;
  allocator<char> local_111;
  string local_110;
  int local_f0;
  allocator<char> local_e9;
  string local_e8;
  unsigned_short local_c4;
  allocator<char> local_c1;
  string local_c0;
  short local_9c;
  allocator<char> local_99;
  string local_98;
  uchar local_72;
  allocator<char> local_71;
  string local_70;
  char local_4d [20];
  allocator<char> local_39;
  string local_38;
  string *local_18;
  CJSON *json_local;
  PrimitiveTestClass *this_local;
  
  local_18 = (string *)json;
  json_local = (CJSON *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"c",&local_39);
  local_4d[0] = '\0';
  cVar2 = CJSON::GetValue<char,_nullptr>(json,&local_38,local_4d);
  this->c = cVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"uc",&local_71);
  local_72 = '\0';
  uVar3 = CJSON::GetValue<unsigned_char,_nullptr>((CJSON *)psVar1,&local_70,&local_72);
  this->uc = uVar3;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"s",&local_99);
  local_9c = 0;
  sVar4 = CJSON::GetValue<short,_nullptr>((CJSON *)psVar1,&local_98,&local_9c);
  this->s = sVar4;
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"us",&local_c1);
  local_c4 = 0;
  uVar5 = CJSON::GetValue<unsigned_short,_nullptr>((CJSON *)psVar1,&local_c0,&local_c4);
  this->us = uVar5;
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"i",&local_e9);
  local_f0 = 0;
  iVar6 = CJSON::GetValue<int,_nullptr>((CJSON *)psVar1,&local_e8,&local_f0);
  this->i = iVar6;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"ui",&local_111);
  local_118 = 0;
  uVar7 = CJSON::GetValue<unsigned_int,_nullptr>((CJSON *)psVar1,&local_110,&local_118);
  this->ui = uVar7;
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"l",&local_139);
  local_148 = 0;
  lVar8 = CJSON::GetValue<long,_nullptr>((CJSON *)psVar1,&local_138,&local_148);
  this->l = lVar8;
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"ul",&local_169);
  local_178 = 0;
  uVar9 = CJSON::GetValue<unsigned_long,_nullptr>((CJSON *)psVar1,&local_168,&local_178);
  this->ul = uVar9;
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"ll",&local_199);
  local_1a8 = 0;
  lVar10 = CJSON::GetValue<long_long,_nullptr>((CJSON *)psVar1,&local_198,&local_1a8);
  this->ll = lVar10;
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"ull",&local_1c9);
  local_1d8 = 0;
  plVar11 = (longdouble *)
            CJSON::GetValue<unsigned_long_long,_nullptr>((CJSON *)psVar1,&local_1c8,&local_1d8);
  this->ull = (unsigned_long_long)plVar11;
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"f",&local_1f9);
  local_200 = 0.0;
  fVar25 = CJSON::GetValue<float,_nullptr>((CJSON *)psVar1,&local_1f8,&local_200);
  this->f = fVar25;
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"d",(allocator<char> *)(local_250 + 0x2f));
  local_250._32_8_ = (_Base_ptr)0x0;
  dVar26 = CJSON::GetValue<double,_nullptr>((CJSON *)psVar1,&local_220,(double *)(local_250 + 0x20))
  ;
  this->d = dVar26;
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)(local_250 + 0x2f));
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_250,"ld",&local_251);
  local_268 = (longdouble)0;
  CJSON::GetValue<long_double,_nullptr>
            ((longdouble *)psVar1,(CJSON *)local_250,(string *)&local_268,plVar11);
  this->ld = in_ST0;
  std::__cxx11::string::~string((string *)local_250);
  std::allocator<char>::~allocator(&local_251);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"str",&local_289);
  tmp = 0;
  pcVar12 = CJSON::GetValue<char_*,_nullptr>((CJSON *)psVar1,&local_288,(char **)&tmp);
  this->str = pcVar12;
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"pc",&local_2c1);
  pcVar12 = CJSON::GetValue<char*>((CJSON *)psVar1,&local_2c0,&local_2a0);
  this->pc = pcVar12;
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"puc",&local_2e9);
  puVar13 = CJSON::GetValue<unsigned_char*>((CJSON *)psVar1,&local_2e8,&local_2a0);
  this->puc = puVar13;
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"ps",&local_311);
  psVar14 = CJSON::GetValue<short*>((CJSON *)psVar1,&local_310,&local_2a0);
  this->ps = psVar14;
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"pus",&local_339);
  puVar15 = CJSON::GetValue<unsigned_short*>((CJSON *)psVar1,&local_338,&local_2a0);
  this->pus = puVar15;
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"pi",&local_361);
  piVar16 = CJSON::GetValue<int*>((CJSON *)psVar1,&local_360,&local_2a0);
  this->pi = piVar16;
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"pui",&local_389);
  puVar17 = CJSON::GetValue<unsigned_int*>((CJSON *)psVar1,&local_388,&local_2a0);
  this->pui = puVar17;
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"pl",&local_3b1);
  plVar18 = CJSON::GetValue<long*>((CJSON *)psVar1,&local_3b0,&local_2a0);
  this->pl = plVar18;
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"pul",&local_3d9);
  puVar19 = CJSON::GetValue<unsigned_long*>((CJSON *)psVar1,&local_3d8,&local_2a0);
  this->pul = puVar19;
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"pll",&local_401);
  plVar20 = CJSON::GetValue<long_long*>((CJSON *)psVar1,&local_400,&local_2a0);
  this->pll = plVar20;
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"pull",&local_429);
  puVar21 = CJSON::GetValue<unsigned_long_long*>((CJSON *)psVar1,&local_428,&local_2a0);
  this->pull = puVar21;
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"pf",&local_451);
  pfVar22 = CJSON::GetValue<float*>((CJSON *)psVar1,&local_450,&local_2a0);
  this->pf = pfVar22;
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"pd",&local_479);
  pdVar23 = CJSON::GetValue<double*>((CJSON *)psVar1,&local_478,&local_2a0);
  this->pd = pdVar23;
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"pld",&local_4a1);
  plVar11 = CJSON::GetValue<long_double*>((CJSON *)psVar1,&local_4a0,&local_2a0);
  this->pld = plVar11;
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"pto",(allocator<char> *)(local_4e0 + 0x17));
  pTVar24 = CJSON::GetValue<TestArrObj*>((CJSON *)psVar1,&local_4c8,&local_2a0);
  this->pto = pTVar24;
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_4e0 + 0x17));
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,"spi",(allocator<char> *)(local_518 + 0x17));
  CJSON::GetValue<std::shared_ptr<int>>((CJSON *)local_4e0,psVar1,(size_t *)local_500);
  std::shared_ptr<int>::operator=(&this->spi,(shared_ptr<int> *)local_4e0);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)local_4e0);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)(local_518 + 0x17));
  psVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_538,"spto",&local_539);
  CJSON::GetValue<std::shared_ptr<TestArrObj>>((CJSON *)local_518,psVar1,(size_t *)local_538);
  std::shared_ptr<TestArrObj>::operator=(&this->spto,(shared_ptr<TestArrObj> *)local_518);
  std::shared_ptr<TestArrObj>::~shared_ptr((shared_ptr<TestArrObj> *)local_518);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  return;
}

Assistant:

void Deserialize(CJSON &json)
        {
            c = json.GetValue<char>("c");
            uc = json.GetValue<unsigned char>("uc");
            s = json.GetValue<short>("s");
            us = json.GetValue<unsigned short>("us");
            i = json.GetValue<int>("i");
            ui = json.GetValue<unsigned int>("ui");
            l = json.GetValue<long>("l");
            ul = json.GetValue<unsigned long>("ul");
            ll = json.GetValue<long long>("ll");
            ull = json.GetValue<unsigned long long>("ull");
            f = json.GetValue<float>("f");
            d = json.GetValue<double>("d");
            ld = json.GetValue<long double>("ld");

            str = json.GetValue<char*>("str");

            size_t tmp;

            pc = json.GetValue<char*>("pc", tmp);
            puc = json.GetValue<unsigned char*>("puc", tmp);
            ps = json.GetValue<short*>("ps", tmp);
            pus = json.GetValue<unsigned short*>("pus", tmp);
            pi = json.GetValue<int*>("pi", tmp);
            pui = json.GetValue<unsigned int*>("pui", tmp);
            pl = json.GetValue<long*>("pl", tmp);
            pul = json.GetValue<unsigned long*>("pul", tmp);
            pll = json.GetValue<long long*>("pll", tmp);
            pull = json.GetValue<unsigned long long*>("pull", tmp);
            pf = json.GetValue<float*>("pf", tmp);
            pd = json.GetValue<double*>("pd", tmp);
            pld = json.GetValue<long double*>("pld", tmp);

            pto = json.GetValue<TestArrObj*>("pto", tmp);
            spi = json.GetValue<shared_ptr<int>>("spi", tmp);
            spto = json.GetValue<shared_ptr<TestArrObj>>("spto", tmp);
        }